

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Logging.cpp
# Opt level: O2

double soul::Logger::log(double __x)

{
  Message *in_RDI;
  double extraout_XMM0_Qa;
  
  getCallbackHolder();
  std::mutex::lock(&getCallbackHolder::l.lock);
  if (getCallbackHolder::l.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_soul::Logger::Message_&)>::operator()
              (&getCallbackHolder::l.callback,in_RDI);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&getCallbackHolder::l);
  return extraout_XMM0_Qa;
}

Assistant:

void Logger::log (const Message& message)
{
    auto& holder = getCallbackHolder();
    std::lock_guard<std::mutex> g (holder.lock);

    if (holder.callback != nullptr)
        holder.callback (message);
}